

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

bool __thiscall
OpenMD::SelectionEvaluator::loadScriptFileInternal(SelectionEvaluator *this,string *filename)

{
  bool bVar1;
  long *plVar2;
  string script;
  ifstrstream ifs;
  char buffer [65535];
  string sStack_102d0;
  ifstrstream iStack_102b0;
  undefined1 auStack_10038 [65544];
  
  ifstrstream::ifstrstream(&iStack_102b0,(filename->_M_dataplus)._M_p,_S_in,false);
  bVar1 = ifstrstream::is_open(&iStack_102b0);
  if (bVar1) {
    sStack_102d0._M_string_length = 0;
    sStack_102d0.field_2._M_local_buf[0] = '\0';
    sStack_102d0._M_dataplus._M_p = (pointer)&sStack_102d0.field_2;
    while( true ) {
      std::ios::widen((char)iStack_102b0.super_basic_istream<char,_std::char_traits<char>_>.
                            _vptr_basic_istream[-3] + (char)&iStack_102b0);
      plVar2 = (long *)std::istream::getline((char *)&iStack_102b0,(long)auStack_10038,-1);
      if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
      std::__cxx11::string::append((char *)&sStack_102d0);
    }
    bVar1 = loadScript(this,filename,&sStack_102d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_102d0._M_dataplus._M_p != &sStack_102d0.field_2) {
      operator_delete(sStack_102d0._M_dataplus._M_p,
                      CONCAT71(sStack_102d0.field_2._M_allocated_capacity._1_7_,
                               sStack_102d0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar1 = false;
  }
  ifstrstream::~ifstrstream(&iStack_102b0);
  return bVar1;
}

Assistant:

bool SelectionEvaluator::loadScriptFileInternal(const std::string& filename) {
    ifstrstream ifs(filename.c_str());
    if (!ifs.is_open()) { return false; }

    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string script;
    while (ifs.getline(buffer, bufferSize)) {
      script += buffer;
    }
    return loadScript(filename, script);
  }